

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_test.cpp
# Opt level: O1

void SayHelloWorld(void)

{
  ostream *poVar1;
  LockGuard lock;
  LockGuard local_10;
  
  usleep(1000);
  LockGuard::LockGuard(&local_10,&mutex);
  pthread_self();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", Hello World",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  globalCnt = globalCnt + 1;
  LockGuard::~LockGuard(&local_10);
  return;
}

Assistant:

void SayHelloWorld()
{
	usleep(1000);
	LockGuard lock(mutex);
	cout << (unsigned int)pthread_self() << ", Hello World" << endl;
	++globalCnt;
}